

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gogoing_util.cpp
# Opt level: O0

int going_accept(int sockfd,sockaddr *addr,socklen_t *addrlen)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *local_38;
  int ret_fd;
  socklen_t *addrlen_local;
  sockaddr *addr_local;
  int sockfd_local;
  
  do {
    iVar1 = accept(sockfd,(sockaddr *)addr,addrlen);
    if (0 < iVar1) {
      return iVar1;
    }
  } while ((((iVar1 != -1) || (piVar2 = __errno_location(), *piVar2 == 0xb)) ||
           (piVar2 = __errno_location(), *piVar2 == 0x47)) ||
          ((piVar2 = __errno_location(), *piVar2 == 4 ||
           (piVar2 = __errno_location(), __stream = _stderr, *piVar2 == 0x67))));
  piVar2 = __errno_location();
  if (*piVar2 == 0) {
    local_38 = "None";
  }
  else {
    piVar2 = __errno_location();
    local_38 = strerror(*piVar2);
  }
  fprintf(__stream,"[ERROR] (%s:%d: errno: %s) accept failed.\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/tangwz[P]Gogoing/src/Gogoing_util.cpp"
          ,0x18b,local_38);
  exit(-1);
}

Assistant:

int going_accept(int sockfd, struct sockaddr* addr, socklen_t* addrlen)
{
	int ret_fd = 0;
	for(;;){
		ret_fd = accept(sockfd, addr, addrlen);
		if(ret_fd > 0)
			break;
		else if(ret_fd == -1){
			//由于我们把监听套接字设置为了非阻塞模式
			if(errno != EAGAIN && errno != EPROTO && 
				errno != EINTR && errno != ECONNABORTED){
				log_err("accept failed.");
				exit(-1);
			}
		}else{
			continue;
		}
	}
	return ret_fd;
}